

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O2

shared_ptr<helics::Broker> __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
          (SearchableObjectHolder<helics::Broker,_helics::CoreType> *this,
          function<bool_(const_std::shared_ptr<helics::Broker>_&)> *operand)

{
  _Manager_type *pp_Var1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
  _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Broker> sVar3;
  
  std::mutex::lock((mutex *)operand);
  pp_Var1 = &operand[1].super__Function_base._M_manager;
  _Var2 = std::
          __find_if<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>,__gnu_cxx::__ops::_Iter_pred<gmlc::concurrency::SearchableObjectHolder<helics::Broker,helics::CoreType>::findObject(std::function<bool(std::shared_ptr<helics::Broker>const&)>)::_lambda(auto:1&)_1_>>
                    (*(undefined8 *)&operand[2].super__Function_base._M_functor,pp_Var1);
  if (_Var2._M_node == (_Base_ptr)pp_Var1) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)(_Var2._M_node + 2));
  }
  pthread_mutex_unlock((pthread_mutex_t *)operand);
  sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<helics::Broker>)
         sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<X>
        findObject(std::function<bool(const std::shared_ptr<X>&)> operand)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto obj =
            std::find_if(objectMap.begin(),
                         objectMap.end(),
                         [&operand](auto& val) { return operand(val.second); });
        if (obj != objectMap.end()) {
            return obj->second;
        }
        return nullptr;
    }